

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O3

void __thiscall Clasp::ClaspVmtf::endInit(ClaspVmtf *this,Solver *s)

{
  uint *__last;
  uint uVar1;
  uint32 uVar2;
  pointer puVar3;
  pointer pVVar4;
  size_type sVar5;
  uint *__buffer;
  int iVar6;
  uint32 uVar7;
  ulong uVar8;
  long lVar9;
  uint32 *puVar10;
  ulong uVar11;
  uint32 uVar12;
  pair<unsigned_int_*,_long> pVar13;
  _Iter_comp_iter<Clasp::ClaspVmtf::LessLevel> __comp;
  _Iter_comp_iter<Clasp::ClaspVmtf::LessLevel> __comp_00;
  VarVec vars;
  uint local_4c;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  Score *local_38;
  
  if (((this->types_).m & 1) == 0) {
    uVar1 = (s->assign_).assign_.ebo_.size;
    if (uVar1 != 1) {
      puVar3 = (s->assign_).assign_.ebo_.buf;
      pVVar4 = (this->score_).ebo_.buf;
      uVar12 = this->decay_;
      uVar7 = this->nList_;
      uVar8 = 2;
      if (2 < uVar1) {
        uVar8 = (ulong)uVar1;
      }
      puVar10 = &pVVar4[1].decay_;
      uVar11 = 1;
      do {
        if ((puVar3[uVar11] & 3) == 0) {
          iVar6 = uVar12 - *puVar10;
          if (iVar6 != 0) {
            puVar10[-2] = puVar10[-2] >> ((char)iVar6 * '\x02' & 0x1fU);
            *puVar10 = uVar12;
          }
          if (((VarInfo *)(puVar10 + -4))->prev_ == puVar10[-3]) {
            uVar1 = pVVar4->prev_;
            puVar10[-3] = 0;
            ((VarInfo *)(puVar10 + -4))->prev_ = uVar1;
            pVVar4[uVar1].next_ = (Var)uVar11;
            pVVar4->prev_ = (Var)uVar11;
            uVar7 = uVar7 + 1;
            this->nList_ = uVar7;
          }
        }
        uVar11 = uVar11 + 1;
        puVar10 = puVar10 + 5;
      } while (uVar8 != uVar11);
    }
  }
  else {
    uVar12 = this->decay_;
    local_48.ebo_.buf = (uint *)0x0;
    local_48.ebo_.size = 0;
    local_48.ebo_.cap = 0;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&local_48,(s->assign_).assign_.ebo_.size - this->nList_);
    uVar12 = uVar12 + 1;
    local_4c = 1;
    sVar5 = (s->assign_).assign_.ebo_.size;
    if (sVar5 != 1) {
      do {
        uVar8 = (ulong)local_4c;
        if (((s->assign_).assign_.ebo_.buf[uVar8] & 3) == 0) {
          pVVar4 = (this->score_).ebo_.buf;
          uVar7 = this->decay_;
          iVar6 = uVar7 - pVVar4[uVar8].decay_;
          if (iVar6 != 0) {
            pVVar4[uVar8].activity_ = pVVar4[uVar8].activity_ >> ((char)iVar6 * '\x02' & 0x1fU);
            pVVar4[uVar8].decay_ = uVar7;
          }
          if (pVVar4[local_4c].prev_ == pVVar4[local_4c].next_) {
            uVar7 = momsScore(s,local_4c);
            pVVar4 = (this->score_).ebo_.buf;
            pVVar4[local_4c].activity_ = uVar7;
            pVVar4[local_4c].decay_ = uVar12;
            bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&local_48,&local_4c);
            sVar5 = (s->assign_).assign_.ebo_.size;
          }
        }
        local_4c = local_4c + 1;
      } while (local_4c <= sVar5 - 1);
    }
    puVar3 = local_48.ebo_.buf;
    uVar8 = local_48.ebo_._8_8_ & 0xffffffff;
    if (uVar8 != 0) {
      local_38 = &this->score_;
      __last = local_48.ebo_.buf + uVar8;
      pVar13 = std::get_temporary_buffer<unsigned_int>(uVar8 + 1 >> 1);
      __buffer = pVar13.first;
      if (__buffer == (uint *)0x0) {
        __comp_00._M_comp.sc_ = local_38;
        __comp_00._M_comp.s_ = s;
        std::
        __inplace_stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::ClaspVmtf::LessLevel>>
                  (puVar3,__last,__comp_00);
      }
      else {
        __comp._M_comp.sc_ = local_38;
        __comp._M_comp.s_ = s;
        std::
        __stable_sort_adaptive<unsigned_int*,unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::ClaspVmtf::LessLevel>>
                  (puVar3,__last,__buffer,pVar13.second,__comp);
      }
      operator_delete(__buffer);
      if ((local_48.ebo_._8_8_ & 0xffffffff) != 0) {
        uVar7 = this->nList_;
        pVVar4 = (this->score_).ebo_.buf;
        uVar2 = this->decay_;
        lVar9 = 0;
        uVar8 = (ulong)pVVar4->prev_;
        do {
          uVar7 = uVar7 + 1;
          uVar1 = *(uint *)((long)local_48.ebo_.buf + lVar9);
          uVar11 = (ulong)uVar1;
          pVVar4[uVar11].next_ = 0;
          pVVar4[uVar11].prev_ = (Var)uVar8;
          pVVar4[uVar8].next_ = uVar1;
          pVVar4->prev_ = uVar1;
          this->nList_ = uVar7;
          if (pVVar4[*(uint *)((long)local_48.ebo_.buf + lVar9)].decay_ == uVar12) {
            pVVar4[*(uint *)((long)local_48.ebo_.buf + lVar9)].activity_ = 0;
            pVVar4[*(uint *)((long)local_48.ebo_.buf + lVar9)].decay_ = uVar2;
          }
          lVar9 = lVar9 + 4;
          uVar8 = uVar11;
        } while ((local_48.ebo_._8_8_ & 0xffffffff) << 2 != lVar9);
      }
    }
    if (local_48.ebo_.buf != (uint *)0x0) {
      operator_delete(local_48.ebo_.buf);
    }
  }
  this->front_ = ((this->score_).ebo_.buf)->next_;
  return;
}

Assistant:

void ClaspVmtf::endInit(Solver& s) {
	bool moms = types_.inSet(Constraint_t::Static);
	if (!moms) {
		// - add all new vars
		for (Var v = 1; v <= s.numVars(); ++v) {
			if (s.value(v) == value_free) {
				score_[v].activity(decay_);
				if (!score_[v].inList()) {
					addToList(v);
				}
			}
		}
	}
	else {
		// - set activity of all vars not in list to moms
		// - append new vars in moms-activity order
		const uint32 momsStamp = decay_ + 1;
		const uint32 assumeNew = (s.numVars() + 1) - nList_;
		VarVec vars;
		vars.reserve(assumeNew);
		for (Var v = 1; v <= s.numVars(); ++v) {
			if (s.value(v) == value_free) {
				score_[v].activity(decay_);
				if (!score_[v].inList()) {
					score_[v].activity_ = momsScore(s, v);
					score_[v].decay_    = momsStamp;
					vars.push_back(v);
				}
			}
		}
		std::stable_sort(vars.begin(), vars.end(), LessLevel(s, score_));
		for (VarVec::iterator it = vars.begin(); it != vars.end(); ++it) {
			addToList(*it);
			if (score_[*it].decay_ == momsStamp) {
				score_[*it].activity_ = 0;
				score_[*it].decay_    = decay_;
			}
		}
	}
	front_ = getFront();
}